

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int arkLSSetLinSysFn(void *arkode_mem,ARKLsLinSysFn linsys)

{
  int iVar1;
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  
  iVar1 = arkLs_AccessLMem(arkode_mem,"arkLSSetJacFn",&ark_mem,&arkls_mem);
  if (iVar1 == 0) {
    if (linsys == (ARKLsLinSysFn)0x0) {
      arkls_mem->user_linsys = 0;
      arkls_mem->linsys = arkLsLinSys;
    }
    else {
      if (arkls_mem->A == (SUNMatrix)0x0) {
        arkProcessError(ark_mem,-3,"ARKLS","arkLSSetLinSysFn",
                        "Linear system setup routine cannot be supplied for NULL SUNMatrix");
        return -3;
      }
      arkls_mem->user_linsys = 1;
      arkls_mem->linsys = linsys;
      ark_mem = (ARKodeMem)ark_mem->user_data;
    }
    arkls_mem->A_data = ark_mem;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int arkLSSetLinSysFn(void *arkode_mem, ARKLsLinSysFn linsys)
{
  ARKodeMem ark_mem;
  ARKLsMem  arkls_mem;
  int       retval;

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(arkode_mem, "arkLSSetJacFn",
                            &ark_mem, &arkls_mem);
  if (retval != ARKLS_SUCCESS) return(retval);

  /* return with failure if linsys cannot be used */
  if ((linsys != NULL) && (arkls_mem->A == NULL)) {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS", "arkLSSetLinSysFn",
                   "Linear system setup routine cannot be supplied for NULL SUNMatrix");
    return(ARKLS_ILL_INPUT);
  }

  /* set the linear system routine pointer, and update relevant flags */
  if (linsys != NULL) {
    arkls_mem->user_linsys = SUNTRUE;
    arkls_mem->linsys      = linsys;
    arkls_mem->A_data      = ark_mem->user_data;
  } else {
    arkls_mem->user_linsys = SUNFALSE;
    arkls_mem->linsys      = arkLsLinSys;
    arkls_mem->A_data      = ark_mem;
  }

  return(ARKLS_SUCCESS);
}